

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit_library.cpp
# Opt level: O3

void __thiscall
lsim::ModelCircuitLibrary::ModelCircuitLibrary(ModelCircuitLibrary *this,char *name,char *path)

{
  allocator local_12;
  allocator local_11;
  
  std::__cxx11::string::string((string *)this,name,&local_11);
  std::__cxx11::string::string((string *)&this->m_path,path,&local_12);
  (this->m_circuits).
  super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_circuits).
  super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_circuits).
  super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_circuit_lut)._M_h._M_buckets = &(this->m_circuit_lut)._M_h._M_single_bucket;
  (this->m_circuit_lut)._M_h._M_bucket_count = 1;
  (this->m_circuit_lut)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_circuit_lut)._M_h._M_element_count = 0;
  (this->m_circuit_lut)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_circuit_lut)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_circuit_lut)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_main_circuit)._M_dataplus._M_p = (pointer)&(this->m_main_circuit).field_2;
  (this->m_main_circuit)._M_string_length = 0;
  (this->m_main_circuit).field_2._M_local_buf[0] = '\0';
  (this->m_references).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_references).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_references).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ModelCircuitLibrary::ModelCircuitLibrary(const char *name, const char *path) :
        m_name(name),
        m_path(path) {
}